

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_char,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  iVar4 = k->v1;
  if (iVar4 != k->v2) {
    fVar1 = k->A;
    do {
      iVar3 = k->rowlen - iVar4;
      iVar2 = iVar3 - k->w2;
      if (iVar2 < k->u1) {
        iVar2 = k->u1;
      }
      iVar3 = iVar3 - k->w1;
      if (k->u2 < iVar3) {
        iVar3 = k->u2;
      }
      if (0 < iVar3 - iVar2) {
        pbVar5 = (byte *)((long)((k->rowlen * iVar4 + iVar2) * 4) + (long)data);
        pbVar6 = pbVar5 + (iVar3 - iVar2) * 4;
        fVar8 = (float)iVar2 - k->u;
        fVar7 = (float)iVar4 - k->v;
        fVar9 = fVar8 * k->A * fVar8 + (k->B * fVar8 + k->C * fVar7) * fVar7;
        fVar7 = (fVar8 + fVar8 + 1.0) * k->A + fVar7 * k->B;
        do {
          if (fVar9 < 1.0) {
            fVar8 = expf(fVar9 * -6.125);
            fVar8 = fVar8 * k->wscale;
            k->weight = k->weight + fVar8;
            *result = (float)*pbVar5 * fVar8 + *result;
            result[1] = (float)pbVar5[1] * fVar8 + result[1];
            result[2] = (float)pbVar5[2] * fVar8 + result[2];
            result[3] = (float)pbVar5[3] * fVar8 + result[3];
          }
          fVar9 = fVar9 + fVar7;
          fVar7 = fVar7 + fVar1 + fVar1;
          pbVar5 = pbVar5 + 4;
        } while (pbVar5 < pbVar6);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != k->v2);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }